

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

int __thiscall cmCPackGenerator::PrepareNames(cmCPackGenerator *this)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  bool local_1dd2;
  allocator local_1b91;
  string local_1b90;
  string local_1b70 [32];
  undefined1 local_1b50 [8];
  ostringstream cmCPackLog_msg_11;
  allocator local_19d1;
  string local_19d0;
  string local_19b0 [39];
  allocator local_1989;
  string local_1988;
  cmXMLSafe local_1968;
  string local_1950 [32];
  undefined1 local_1930 [8];
  ostringstream cmCPackLog_msg_10;
  undefined1 local_17b8 [8];
  string line;
  ostringstream ostr;
  string local_1620 [32];
  undefined1 local_1600 [8];
  ostringstream cmCPackLog_msg_9;
  long local_1488;
  ifstream ifs;
  string local_1280 [32];
  undefined1 local_1260 [8];
  ostringstream cmCPackLog_msg_8;
  string local_10e8 [32];
  undefined1 local_10c8 [8];
  ostringstream cmCPackLog_msg_7;
  allocator local_f49;
  string local_f48;
  char *local_f28;
  char *descFileName;
  undefined1 local_f00 [8];
  ostringstream cmCPackLog_msg_6;
  allocator local_d81;
  string local_d80;
  allocator local_d59;
  string local_d58;
  string local_d38;
  allocator local_d11;
  string local_d10;
  allocator local_ce9;
  string local_ce8;
  allocator local_cc1;
  string local_cc0;
  allocator local_c99;
  string local_c98;
  allocator local_c71;
  string local_c70;
  allocator local_c49;
  string local_c48;
  allocator local_c21;
  string local_c20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c00;
  undefined1 local_be0 [8];
  string outFile;
  allocator local_b99;
  string local_b98;
  allocator local_b71;
  string local_b70 [8];
  string destFile;
  undefined1 local_b30 [8];
  ostringstream cmCPackLog_msg_5;
  allocator local_9b1;
  string local_9b0;
  char *local_990;
  char *pdir;
  undefined1 local_968 [8];
  ostringstream cmCPackLog_msg_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0;
  allocator local_7c9;
  undefined1 local_7c8 [8];
  string outName;
  string local_7a0 [32];
  undefined1 local_780 [8];
  ostringstream cmCPackLog_msg_3;
  allocator local_601;
  string local_600;
  char *local_5e0;
  char *pfname;
  string topDirectory;
  string local_5b0;
  allocator local_589;
  string local_588;
  char *local_568;
  char *toplevelTag;
  string local_558;
  string local_538 [8];
  string tempDirectory;
  ostringstream local_4f8 [8];
  ostringstream cmCPackLog_msg_2;
  string local_380 [32];
  ostringstream local_360 [8];
  ostringstream cmCPackLog_msg_1;
  allocator local_1e1;
  string local_1e0;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream cmCPackLog_msg;
  cmCPackGenerator *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar5 = std::operator<<((ostream *)local_190,"Create temp directory.");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->Logger;
  std::__cxx11::ostringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x45,pcVar6);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e0,"CPACK_SET_DESTDIR",&local_1e1);
  bVar2 = IsOn(this,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  if (bVar2) {
    iVar4 = (*(this->super_cmObject)._vptr_cmObject[0x15])();
    if (iVar4 == 3) {
      std::__cxx11::ostringstream::ostringstream(local_360);
      poVar5 = std::operator<<((ostream *)local_360,"CPACK_SET_DESTDIR is set to ON but the \'");
      poVar5 = std::operator<<(poVar5,(string *)&this->Name);
      poVar5 = std::operator<<(poVar5,"\' generator does NOT support it.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x4f,pcVar6);
      std::__cxx11::string::~string(local_380);
      std::__cxx11::ostringstream::~ostringstream(local_360);
      return 0;
    }
    iVar4 = (*(this->super_cmObject)._vptr_cmObject[0x15])();
    if (iVar4 == 2) {
      std::__cxx11::ostringstream::ostringstream(local_4f8);
      poVar5 = std::operator<<((ostream *)local_4f8,"CPACK_SET_DESTDIR is set to ON but it is ");
      poVar5 = std::operator<<(poVar5,"usually a bad idea to do that with \'");
      poVar5 = std::operator<<(poVar5,(string *)&this->Name);
      poVar5 = std::operator<<(poVar5,"\' generator. Use at your own risk.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x58,pcVar6);
      std::__cxx11::string::~string((string *)(tempDirectory.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream(local_4f8);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_558,"CPACK_PACKAGE_DIRECTORY",(allocator *)((long)&toplevelTag + 7));
  pcVar6 = GetOption(this,&local_558);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_538,pcVar6,(allocator *)((long)&toplevelTag + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&toplevelTag + 6));
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator((allocator<char> *)((long)&toplevelTag + 7));
  std::__cxx11::string::operator+=(local_538,"/_CPack_Packages/");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_588,"CPACK_TOPLEVEL_TAG",&local_589);
  pcVar6 = GetOption(this,&local_588);
  std::__cxx11::string::~string((string *)&local_588);
  std::allocator<char>::~allocator((allocator<char> *)&local_589);
  local_568 = pcVar6;
  if (pcVar6 != (char *)0x0) {
    std::__cxx11::string::operator+=(local_538,pcVar6);
    std::__cxx11::string::operator+=(local_538,"/");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5b0,"CPACK_GENERATOR",
             (allocator *)(topDirectory.field_2._M_local_buf + 0xf));
  pcVar6 = GetOption(this,&local_5b0);
  std::__cxx11::string::operator+=(local_538,pcVar6);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::allocator<char>::~allocator((allocator<char> *)(topDirectory.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)&pfname,local_538);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_600,"CPACK_PACKAGE_FILE_NAME",&local_601);
  pcVar6 = GetOption(this,&local_600);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator((allocator<char> *)&local_601);
  local_5e0 = pcVar6;
  if (pcVar6 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_780);
    poVar5 = std::operator<<((ostream *)local_780,"CPACK_PACKAGE_FILE_NAME not specified");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Logger;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x6a,pcVar6);
    std::__cxx11::string::~string(local_7a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_780);
    this_local._4_4_ = 0;
    outName.field_2._12_4_ = 1;
    goto LAB_0046ed25;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_7c8,pcVar6,&local_7c9);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
  std::operator+(&local_7f0,"/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7c8);
  std::__cxx11::string::operator+=(local_538,(string *)&local_7f0);
  std::__cxx11::string::~string((string *)&local_7f0);
  iVar4 = (*(this->super_cmObject)._vptr_cmObject[5])();
  if (CONCAT44(extraout_var,iVar4) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_968);
    poVar5 = std::operator<<((ostream *)local_968,"No output extension specified");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Logger;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x72,pcVar6);
    std::__cxx11::string::~string((string *)&pdir);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_968);
    this_local._4_4_ = 0;
    outName.field_2._12_4_ = 1;
  }
  else {
    iVar4 = (*(this->super_cmObject)._vptr_cmObject[5])();
    std::__cxx11::string::operator+=((string *)local_7c8,(char *)CONCAT44(extraout_var_00,iVar4));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_9b0,"CPACK_PACKAGE_DIRECTORY",&local_9b1);
    pcVar6 = GetOption(this,&local_9b0);
    std::__cxx11::string::~string((string *)&local_9b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_9b1);
    local_990 = pcVar6;
    if (pcVar6 == (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b30);
      poVar5 = std::operator<<((ostream *)local_b30,"CPACK_PACKAGE_DIRECTORY not specified");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x7a,pcVar6);
      std::__cxx11::string::~string((string *)(destFile.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b30);
      this_local._4_4_ = 0;
      outName.field_2._12_4_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b70,pcVar6,&local_b71);
      std::allocator<char>::~allocator((allocator<char> *)&local_b71);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b98,"CPACK_OUTPUT_FILE_PREFIX",&local_b99);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      SetOptionIfNotSet(this,&local_b98,pcVar6);
      std::__cxx11::string::~string((string *)&local_b98);
      std::allocator<char>::~allocator((allocator<char> *)&local_b99);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&outFile.field_2 + 8),"/",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7c8)
      ;
      std::__cxx11::string::operator+=(local_b70,(string *)(outFile.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(outFile.field_2._M_local_buf + 8));
      std::operator+(&local_c00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pfname,
                     "/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_be0,
                     &local_c00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7c8)
      ;
      std::__cxx11::string::~string((string *)&local_c00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c20,"CPACK_TOPLEVEL_DIRECTORY",&local_c21);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      SetOptionIfNotSet(this,&local_c20,pcVar6);
      std::__cxx11::string::~string((string *)&local_c20);
      std::allocator<char>::~allocator((allocator<char> *)&local_c21);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c48,"CPACK_TEMPORARY_DIRECTORY",&local_c49);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      SetOptionIfNotSet(this,&local_c48,pcVar6);
      std::__cxx11::string::~string((string *)&local_c48);
      std::allocator<char>::~allocator((allocator<char> *)&local_c49);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c70,"CPACK_OUTPUT_FILE_NAME",&local_c71);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      SetOptionIfNotSet(this,&local_c70,pcVar6);
      std::__cxx11::string::~string((string *)&local_c70);
      std::allocator<char>::~allocator((allocator<char> *)&local_c71);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c98,"CPACK_OUTPUT_FILE_PATH",&local_c99);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      SetOptionIfNotSet(this,&local_c98,pcVar6);
      std::__cxx11::string::~string((string *)&local_c98);
      std::allocator<char>::~allocator((allocator<char> *)&local_c99);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_cc0,"CPACK_TEMPORARY_PACKAGE_FILE_NAME",&local_cc1);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      SetOptionIfNotSet(this,&local_cc0,pcVar6);
      std::__cxx11::string::~string((string *)&local_cc0);
      std::allocator<char>::~allocator((allocator<char> *)&local_cc1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_ce8,"CPACK_INSTALL_DIRECTORY",&local_ce9);
      iVar4 = (*(this->super_cmObject)._vptr_cmObject[0xb])();
      SetOptionIfNotSet(this,&local_ce8,(char *)CONCAT44(extraout_var_01,iVar4));
      std::__cxx11::string::~string((string *)&local_ce8);
      std::allocator<char>::~allocator((allocator<char> *)&local_ce9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d10,"CPACK_NATIVE_INSTALL_DIRECTORY",&local_d11)
      ;
      iVar4 = (*(this->super_cmObject)._vptr_cmObject[0xb])();
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_d58,(char *)CONCAT44(extraout_var_02,iVar4),&local_d59);
      cmsys::SystemTools::ConvertToOutputPath(&local_d38,&local_d58);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      SetOptionIfNotSet(this,&local_d10,pcVar6);
      std::__cxx11::string::~string((string *)&local_d38);
      std::__cxx11::string::~string((string *)&local_d58);
      std::allocator<char>::~allocator((allocator<char> *)&local_d59);
      std::__cxx11::string::~string((string *)&local_d10);
      std::allocator<char>::~allocator((allocator<char> *)&local_d11);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_d80,"CPACK_TEMPORARY_INSTALL_DIRECTORY",&local_d81);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      SetOptionIfNotSet(this,&local_d80,pcVar6);
      std::__cxx11::string::~string((string *)&local_d80);
      std::allocator<char>::~allocator((allocator<char> *)&local_d81);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f00);
      poVar5 = std::operator<<((ostream *)local_f00,"Look for: CPACK_PACKAGE_DESCRIPTION_FILE");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x8f,pcVar6);
      std::__cxx11::string::~string((string *)&descFileName);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f48,"CPACK_PACKAGE_DESCRIPTION_FILE",&local_f49)
      ;
      pcVar6 = GetOption(this,&local_f48);
      std::__cxx11::string::~string((string *)&local_f48);
      std::allocator<char>::~allocator((allocator<char> *)&local_f49);
      local_f28 = pcVar6;
      if (pcVar6 == (char *)0x0) {
LAB_0046ea48:
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_19d0,"CPACK_PACKAGE_DESCRIPTION",&local_19d1);
        pcVar6 = GetOption(this,&local_19d0);
        std::__cxx11::string::~string((string *)&local_19d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_19d1);
        if (pcVar6 == (char *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b50);
          poVar5 = std::operator<<((ostream *)local_1b50,
                                   "Project description not specified. Please specify CPACK_PACKAGE_DESCRIPTION or CPACK_PACKAGE_DESCRIPTION_FILE."
                                  );
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->Logger;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0xb4,pcVar6);
          std::__cxx11::string::~string(local_1b70);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b50);
          this_local._4_4_ = 0;
          outName.field_2._12_4_ = 1;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_1b90,"CPACK_REMOVE_TOPLEVEL_DIRECTORY",&local_1b91);
          SetOptionIfNotSet(this,&local_1b90,"1");
          std::__cxx11::string::~string((string *)&local_1b90);
          std::allocator<char>::~allocator((allocator<char> *)&local_1b91);
          this_local._4_4_ = 1;
          outName.field_2._12_4_ = 1;
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_10c8);
        poVar5 = std::operator<<((ostream *)local_10c8,"Look for: ");
        poVar5 = std::operator<<(poVar5,local_f28);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->Logger;
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x95,pcVar6);
        std::__cxx11::string::~string(local_10e8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_10c8);
        bVar2 = cmsys::SystemTools::FileExists(local_f28);
        if (bVar2) {
          std::ifstream::ifstream(&local_1488,local_f28,_S_in);
          bVar3 = std::ios::operator!((ios *)((long)&local_1488 + *(long *)(local_1488 + -0x18)));
          if ((bVar3 & 1) == 0) {
            std::__cxx11::ostringstream::ostringstream
                      ((ostringstream *)(line.field_2._M_local_buf + 8));
            std::__cxx11::string::string((string *)local_17b8);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1930);
            poVar5 = std::operator<<((ostream *)local_1930,"Read description file: ");
            poVar5 = std::operator<<(poVar5,local_f28);
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            pcVar1 = this->Logger;
            std::__cxx11::ostringstream::str();
            pcVar6 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar1,2,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0xa8,pcVar6);
            std::__cxx11::string::~string(local_1950);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1930);
            while( true ) {
              bVar2 = std::ios::operator_cast_to_bool
                                ((ios *)((long)&local_1488 + *(long *)(local_1488 + -0x18)));
              local_1dd2 = false;
              if (bVar2) {
                local_1dd2 = cmsys::SystemTools::GetLineFromStream
                                       ((istream *)&local_1488,(string *)local_17b8,(bool *)0x0,-1);
              }
              if (local_1dd2 == false) break;
              cmXMLSafe::cmXMLSafe(&local_1968,(string *)local_17b8);
              poVar5 = ::operator<<((ostream *)((long)&line.field_2 + 8),&local_1968);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_1988,"CPACK_PACKAGE_DESCRIPTION",&local_1989);
            std::__cxx11::ostringstream::str();
            pcVar6 = (char *)std::__cxx11::string::c_str();
            SetOptionIfNotSet(this,&local_1988,pcVar6);
            std::__cxx11::string::~string(local_19b0);
            std::__cxx11::string::~string((string *)&local_1988);
            std::allocator<char>::~allocator((allocator<char> *)&local_1989);
            std::__cxx11::string::~string((string *)local_17b8);
            std::__cxx11::ostringstream::~ostringstream
                      ((ostringstream *)(line.field_2._M_local_buf + 8));
            outName.field_2._12_4_ = 0;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1600);
            poVar5 = std::operator<<((ostream *)local_1600,"Cannot open description file name: ");
            poVar5 = std::operator<<(poVar5,local_f28);
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            pcVar1 = this->Logger;
            std::__cxx11::ostringstream::str();
            pcVar6 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar1,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0xa1,pcVar6);
            std::__cxx11::string::~string(local_1620);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1600);
            this_local._4_4_ = 0;
            outName.field_2._12_4_ = 1;
          }
          std::ifstream::~ifstream(&local_1488);
          if (outName.field_2._12_4_ == 0) goto LAB_0046ea48;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1260);
          poVar5 = std::operator<<((ostream *)local_1260,"Cannot find description file name: [");
          poVar5 = std::operator<<(poVar5,local_f28);
          poVar5 = std::operator<<(poVar5,"]");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->Logger;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x9a,pcVar6);
          std::__cxx11::string::~string(local_1280);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1260);
          this_local._4_4_ = 0;
          outName.field_2._12_4_ = 1;
        }
      }
      std::__cxx11::string::~string((string *)local_be0);
      std::__cxx11::string::~string(local_b70);
    }
  }
  std::__cxx11::string::~string((string *)local_7c8);
LAB_0046ed25:
  std::__cxx11::string::~string((string *)&pfname);
  std::__cxx11::string::~string(local_538);
  return this_local._4_4_;
}

Assistant:

int cmCPackGenerator::PrepareNames()
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
    "Create temp directory." << std::endl);

  // checks CPACK_SET_DESTDIR support
  if (IsOn("CPACK_SET_DESTDIR"))
    {
      if (SETDESTDIR_UNSUPPORTED==SupportsSetDestdir())
        {
          cmCPackLogger(cmCPackLog::LOG_ERROR,
                        "CPACK_SET_DESTDIR is set to ON but the '"
                        << Name << "' generator does NOT support it."
                        << std::endl);
          return 0;
        }
      else if (SETDESTDIR_SHOULD_NOT_BE_USED==SupportsSetDestdir())
        {
          cmCPackLogger(cmCPackLog::LOG_WARNING,
                        "CPACK_SET_DESTDIR is set to ON but it is "
                        << "usually a bad idea to do that with '"
                        << Name << "' generator. Use at your own risk."
                        << std::endl);
        }
  }

  std::string tempDirectory = this->GetOption("CPACK_PACKAGE_DIRECTORY");
  tempDirectory += "/_CPack_Packages/";
  const char* toplevelTag = this->GetOption("CPACK_TOPLEVEL_TAG");
  if ( toplevelTag )
    {
    tempDirectory += toplevelTag;
    tempDirectory += "/";
    }
  tempDirectory += this->GetOption("CPACK_GENERATOR");
  std::string topDirectory = tempDirectory;
  const char* pfname = this->GetOption("CPACK_PACKAGE_FILE_NAME");
  if(!pfname)
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPACK_PACKAGE_FILE_NAME not specified" << std::endl);
    return 0;
    }
  std::string outName = pfname;
  tempDirectory += "/" + outName;
  if(!this->GetOutputExtension())
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "No output extension specified" << std::endl);
    return 0;
    }
  outName += this->GetOutputExtension();
  const char* pdir = this->GetOption("CPACK_PACKAGE_DIRECTORY");
  if(!pdir)
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPACK_PACKAGE_DIRECTORY not specified" << std::endl);
    return 0;
    }

  std::string destFile = pdir;
  this->SetOptionIfNotSet("CPACK_OUTPUT_FILE_PREFIX", destFile.c_str());
  destFile += "/" + outName;
  std::string outFile = topDirectory + "/" + outName;
  this->SetOptionIfNotSet("CPACK_TOPLEVEL_DIRECTORY", topDirectory.c_str());
  this->SetOptionIfNotSet("CPACK_TEMPORARY_DIRECTORY", tempDirectory.c_str());
  this->SetOptionIfNotSet("CPACK_OUTPUT_FILE_NAME", outName.c_str());
  this->SetOptionIfNotSet("CPACK_OUTPUT_FILE_PATH", destFile.c_str());
  this->SetOptionIfNotSet("CPACK_TEMPORARY_PACKAGE_FILE_NAME",
                          outFile.c_str());
  this->SetOptionIfNotSet("CPACK_INSTALL_DIRECTORY", this->GetInstallPath());
  this->SetOptionIfNotSet("CPACK_NATIVE_INSTALL_DIRECTORY",
    cmsys::SystemTools::ConvertToOutputPath(this->GetInstallPath()).c_str());
  this->SetOptionIfNotSet("CPACK_TEMPORARY_INSTALL_DIRECTORY",
                          tempDirectory.c_str());

  cmCPackLogger(cmCPackLog::LOG_DEBUG,
    "Look for: CPACK_PACKAGE_DESCRIPTION_FILE" << std::endl);
  const char* descFileName
    = this->GetOption("CPACK_PACKAGE_DESCRIPTION_FILE");
  if ( descFileName )
    {
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "Look for: " << descFileName << std::endl);
    if ( !cmSystemTools::FileExists(descFileName) )
      {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Cannot find description file name: ["
                    << descFileName << "]" << std::endl);
      return 0;
      }
    cmsys::ifstream ifs(descFileName);
    if ( !ifs )
      {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
        "Cannot open description file name: " << descFileName << std::endl);
      return 0;
      }
    std::ostringstream ostr;
    std::string line;

    cmCPackLogger(cmCPackLog::LOG_VERBOSE,
      "Read description file: " << descFileName << std::endl);
    while ( ifs && cmSystemTools::GetLineFromStream(ifs, line) )
      {
      ostr << cmXMLSafe(line) << std::endl;
      }
    this->SetOptionIfNotSet("CPACK_PACKAGE_DESCRIPTION", ostr.str().c_str());
    }
  if ( !this->GetOption("CPACK_PACKAGE_DESCRIPTION") )
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
      "Project description not specified. Please specify "
      "CPACK_PACKAGE_DESCRIPTION or CPACK_PACKAGE_DESCRIPTION_FILE."
      << std::endl);
    return 0;
    }

  this->SetOptionIfNotSet("CPACK_REMOVE_TOPLEVEL_DIRECTORY", "1");

  return 1;
}